

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-util.cc
# Opt level: O0

void __thiscall
wabt::interp::WriteCall
          (interp *this,Stream *stream,string_view name,FuncType *func_type,Values *params,
          Values *results,Ptr *trap)

{
  bool bVar1;
  size_type sVar2;
  const_pointer pcVar3;
  Values *results_local;
  Values *params_local;
  FuncType *func_type_local;
  Stream *stream_local;
  string_view name_local;
  
  name_local.data_ = name.data_;
  stream_local = stream;
  sVar2 = string_view::length((string_view *)&stream_local);
  pcVar3 = string_view::data((string_view *)&stream_local);
  Stream::Writef((Stream *)this,"%.*s(",sVar2 & 0xffffffff,pcVar3);
  WriteValues((Stream *)this,(ValueTypes *)(name.size_ + 0x10),(Values *)func_type);
  Stream::Writef((Stream *)this,") =>");
  bVar1 = RefPtr::operator_cast_to_bool((RefPtr *)results);
  if (bVar1) {
    WriteTrap((Stream *)this," error",(Ptr *)results);
  }
  else {
    bVar1 = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::empty(params);
    if (!bVar1) {
      Stream::Writef((Stream *)this," ");
      WriteValues((Stream *)this,(ValueTypes *)(name.size_ + 0x28),params);
    }
    Stream::Writef((Stream *)this,"\n");
  }
  return;
}

Assistant:

void WriteCall(Stream* stream,
               string_view name,
               const FuncType& func_type,
               const Values& params,
               const Values& results,
               const Trap::Ptr& trap) {
  stream->Writef(PRIstringview "(", WABT_PRINTF_STRING_VIEW_ARG(name));
  WriteValues(stream, func_type.params, params);
  stream->Writef(") =>");
  if (!trap) {
    if (!results.empty()) {
      stream->Writef(" ");
      WriteValues(stream, func_type.results, results);
    }
    stream->Writef("\n");
  } else {
    WriteTrap(stream, " error", trap);
  }
}